

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

SceneObject * __thiscall
CGL::Application::init_sphere(Application *this,SphereInfo *sphere,Matrix4x4 *transform)

{
  SceneObject *scale_00;
  Vector4D *in_RDX;
  Vector3D *in_RSI;
  double scale;
  Vector3D *position;
  Vector4D *this_00;
  SphereInfo *in_stack_fffffffffffffed8;
  Sphere *in_stack_fffffffffffffee0;
  Vector3D local_118;
  Vector4D local_f8 [3];
  double local_90;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  Vector4D local_68;
  Vector3D local_48;
  Vector3D *local_20;
  Vector3D *local_10;
  
  local_10 = in_RSI;
  Vector4D::Vector4D((Vector4D *)&stack0xffffffffffffff78,0.0,0.0,0.0,1.0);
  this_00 = &local_68;
  Matrix4x4::operator*((Matrix4x4 *)in_stack_ffffffffffffff88,(Vector4D *)in_stack_ffffffffffffff80)
  ;
  Vector4D::projectTo3D(this_00);
  local_20 = &local_48;
  Vector4D::Vector4D(local_f8,1.0,0.0,0.0,0.0);
  Matrix4x4::operator*((Matrix4x4 *)in_stack_ffffffffffffff88,(Vector4D *)in_stack_ffffffffffffff80)
  ;
  Vector4D::to3D(in_RDX);
  local_90 = Vector3D::norm((Vector3D *)0x17981c);
  scale_00 = (SceneObject *)operator_new(0x40);
  Vector3D::Vector3D(&local_118,local_20);
  GLScene::Sphere::Sphere
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,local_10,(double)scale_00);
  return scale_00;
}

Assistant:

GLScene::SceneObject *Application::init_sphere(
    SphereInfo& sphere, const Matrix4x4& transform) {
  const Vector3D& position = (transform * Vector4D(0, 0, 0, 1)).projectTo3D();
  double scale = (transform * Vector4D(1, 0, 0, 0)).to3D().norm();
  return new GLScene::Sphere(sphere, position, scale);
}